

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation.hpp
# Opt level: O0

void __thiscall
pstore::repo::compilation::
compilation<__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
          (compilation *this,typed_address<pstore::indirect_string> triple,size_type size,
          __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
          first_member,
          __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
          last_member)

{
  difference_type value;
  unsigned_long uVar1;
  iterator __result;
  definition *local_58;
  size_type size_local;
  compilation *this_local;
  __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
  last_member_local;
  __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
  first_member_local;
  typed_address<pstore::indirect_string> triple_local;
  
  *&(this->signature_)._M_elems = (_Type)0x6e6f69386c706d43;
  (this->triple_).a_.a_ = (value_type)triple.a_.a_;
  this->size_ = size;
  this->padding1_ = 0;
  local_58 = this->members_;
  do {
    definition::definition(local_58);
    local_58 = local_58 + 1;
  } while ((compilation *)local_58 != this + 1);
  this->padding1_ = 0;
  value = std::
          distance<__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
                    (first_member,last_member);
  uVar1 = unsigned_cast<long,unsigned_long,void>(value);
  if (uVar1 == size) {
    __result = begin(this);
    std::
    copy<__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>,pstore::repo::definition*>
              (first_member,last_member,__result);
    return;
  }
  assert_failed("unsigned_cast (std::distance (first_member, last_member)) == size",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/compilation.hpp"
                ,0x111);
}

Assistant:

compilation::compilation (typed_address<indirect_string> const triple, size_type const size,
                                  Iterator const first_member, Iterator const last_member) noexcept
                : triple_{triple}
                , size_{size} {
            // Assignment to suppress a warning from clang that the field is not used.
            padding1_ = 0;
            PSTORE_STATIC_ASSERT (offsetof (compilation, signature_) == 0);
            PSTORE_STATIC_ASSERT (offsetof (compilation, triple_) == 8);
            PSTORE_STATIC_ASSERT (offsetof (compilation, size_) == 16);
            PSTORE_STATIC_ASSERT (offsetof (compilation, padding1_) == 20);
            PSTORE_STATIC_ASSERT (offsetof (compilation, members_) == 32);

            // This check can safely be an assertion because the method is private and alloc(),
            // the sole caller, performs a full run-time check of the size.
            PSTORE_ASSERT (unsigned_cast (std::distance (first_member, last_member)) == size);

            std::copy (first_member, last_member, this->begin ());
        }